

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# execmd.c
# Opt level: O0

void exeperr(voccxdef *ctx,objnum verb,objnum dobj,objnum prep,objnum iobj)

{
  short in_CX;
  short in_DX;
  undefined2 in_SI;
  voccxdef *in_RDI;
  undefined2 in_R8W;
  int in_stack_00000118;
  objnum in_stack_0000011e;
  runcxdef *in_stack_00000120;
  prpnum in_stack_00000190;
  objnum in_stack_00000192;
  prpnum in_stack_00000194;
  objnum in_stack_00000196;
  uchar **in_stack_00000198;
  runcxdef *in_stack_000001a0;
  int in_stack_000001b0;
  int in_stack_000001b8;
  objnum in_stack_000001c0;
  objnum in_stack_ffffffffffffffee;
  
  if (in_RDI->voccxper2 == 0xffff) {
    vocerr(in_RDI,0x6e,"I don\'t know how to ");
    runpprop(in_stack_000001a0,in_stack_00000198,in_stack_00000196,in_stack_00000194,
             in_stack_00000192,in_stack_00000190,in_stack_000001b0,in_stack_000001b8,
             in_stack_000001c0);
    if (in_DX == -1) {
      vocerr(in_RDI,0x70," anything ");
      if (in_CX == -1) {
        vocerr(in_RDI,0x71,"to");
      }
      else {
        runpprop(in_stack_000001a0,in_stack_00000198,in_stack_00000196,in_stack_00000194,
                 in_stack_00000192,in_stack_00000190,in_stack_000001b0,in_stack_000001b8,
                 in_stack_000001c0);
      }
      vocerr(in_RDI,0x72," ");
      runpprop(in_stack_000001a0,in_stack_00000198,in_stack_00000196,in_stack_00000194,
               in_stack_00000192,in_stack_00000190,in_stack_000001b0,in_stack_000001b8,
               in_stack_000001c0);
    }
    else {
      vocerr(in_RDI,0x6f," ");
      runpprop(in_stack_000001a0,in_stack_00000198,in_stack_00000196,in_stack_00000194,
               in_stack_00000192,in_stack_00000190,in_stack_000001b0,in_stack_000001b8,
               in_stack_000001c0);
    }
    vocerr(in_RDI,0x73,".");
  }
  else {
    runpobj((runcxdef *)CONCAT26(in_SI,CONCAT24(in_DX,CONCAT22(in_CX,in_R8W))),
            in_stack_ffffffffffffffee);
    runpobj((runcxdef *)CONCAT26(in_SI,CONCAT24(in_DX,CONCAT22(in_CX,in_R8W))),
            in_stack_ffffffffffffffee);
    runpobj((runcxdef *)CONCAT26(in_SI,CONCAT24(in_DX,CONCAT22(in_CX,in_R8W))),
            in_stack_ffffffffffffffee);
    runpobj((runcxdef *)CONCAT26(in_SI,CONCAT24(in_DX,CONCAT22(in_CX,in_R8W))),
            in_stack_ffffffffffffffee);
    runfn(in_stack_00000120,in_stack_0000011e,in_stack_00000118);
  }
  return;
}

Assistant:

static void exeperr(voccxdef *ctx, objnum verb, objnum dobj,
                    objnum prep, objnum iobj)
{
    if (ctx->voccxper2 != MCMONINV)
    {
        runpobj(ctx->voccxrun, iobj);
        runpobj(ctx->voccxrun, prep);
        runpobj(ctx->voccxrun, dobj);
        runpobj(ctx->voccxrun, verb);
        runfn(ctx->voccxrun, ctx->voccxper2, 4);
        return;
    }
    
    vocerr(ctx, VOCERR(110), "I don't know how to ");
    runppr(ctx->voccxrun, verb, PRP_SDESC, 0);
    
    if (dobj != MCMONINV)
    {
        vocerr(ctx, VOCERR(111), " ");
        runppr(ctx->voccxrun, dobj, PRP_THEDESC, 0);
    }
    else
    {
        vocerr(ctx, VOCERR(112), " anything ");
        if (prep != MCMONINV)
            runppr(ctx->voccxrun, prep, PRP_SDESC, 0);
        else
            vocerr(ctx, VOCERR(113), "to");
        vocerr(ctx, VOCERR(114), " ");
        runppr(ctx->voccxrun, iobj, PRP_THEDESC, 0);
    }
    vocerr(ctx, VOCERR(115), ".");
}